

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O2

handle_base * __thiscall
printable_sbo_cow::handle<large_printable,_true>::clone_into
          (handle<large_printable,_true> *this,buffer *buf)

{
  handle_base *phVar1;
  large_printable local_2028;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_2028.data_,&(this->value_).data_);
  phVar1 = clone_impl<large_printable>(&local_2028,buf);
  free(local_2028.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  return phVar1;
}

Assistant:

virtual handle_base * clone_into (buffer & buf) const
        { return clone_impl(value_, buf); }